

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O1

void __thiscall
baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::make_init_node_1
          (branch_and_bound_solver<baryonyx::itm::maximize_tag,_float> *this)

{
  pointer __args;
  pointer pnVar1;
  pointer pcVar2;
  size_type sVar3;
  ulong uVar4;
  size_t __len;
  uint local_c;
  
  __args = (this->items).
           super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::item>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_c = 0;
  std::
  vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::node,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::node>>
  ::emplace_back<float&,int&,unsigned_int>
            ((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::node,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::node>>
              *)&this->nodes,&__args->r,&__args->factor,&local_c);
  sVar3 = shared_subvector::emplace(&this->subvector);
  pnVar1 = (this->nodes).
           super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::node>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pnVar1[-1].variables = sVar3;
  pnVar1[-1].z = ((this->items).
                  super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::item>_>
                  ._M_impl.super__Vector_impl_data._M_start)->sum_z;
  uVar4 = (ulong)(this->subvector).m_element_size;
  if (uVar4 != 0) {
    memset((this->subvector).m_container.
           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_start + sVar3,0,uVar4);
  }
  uVar4 = (ulong)(this->nodes).
                 super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::node>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].variables;
  pcVar2 = (this->subvector).m_container.
           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar4 < (ulong)((long)(this->subvector).m_container.
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pcVar2)) {
    pcVar2[uVar4] = '\x01';
    return;
  }
  branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::make_init_node_1();
}

Assistant:

void make_init_node_1()
    {
        nodes.emplace_back(items[0].r, items[0].factor, 0u);
        nodes.back().variables = subvector.emplace();
        nodes.back().z = items[0].sum_z;

        subvector.fill(nodes.back().variables, 0);
        subvector[nodes.back().variables] = 1;
    }